

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Builder.h
# Opt level: O1

void __thiscall arangodb::velocypack::Builder::addCompoundValue(Builder *this,uint8_t type)

{
  ValueLength *pVVar1;
  pointer *ppCVar2;
  uint8_t *puVar3;
  iterator __position;
  ValueLength VVar4;
  CompoundInfo local_20;
  
  reserve(this,9);
  local_20.startPos = this->_pos;
  local_20.indexStartPos =
       (long)(this->_indexes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_finish -
       (long)(this->_indexes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start >> 3;
  __position._M_current =
       (this->_stack).
       super__Vector_base<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->_stack).
      super__Vector_base<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
    ::_M_realloc_insert<arangodb::velocypack::Builder::CompoundInfo>
              (&this->_stack,__position,&local_20);
  }
  else {
    (__position._M_current)->startPos = local_20.startPos;
    (__position._M_current)->indexStartPos = local_20.indexStartPos;
    ppCVar2 = &(this->_stack).
               super__Vector_base<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppCVar2 = *ppCVar2 + 1;
  }
  VVar4 = this->_pos;
  this->_pos = VVar4 + 1;
  this->_start[VVar4] = type;
  pVVar1 = &this->_bufferPtr->_size;
  *pVVar1 = *pVVar1 + 1;
  puVar3 = this->_start + this->_pos;
  puVar3[0] = '\0';
  puVar3[1] = '\0';
  puVar3[2] = '\0';
  puVar3[3] = '\0';
  puVar3[4] = '\0';
  puVar3[5] = '\0';
  puVar3[6] = '\0';
  puVar3[7] = '\0';
  this->_pos = this->_pos + 8;
  pVVar1 = &this->_bufferPtr->_size;
  *pVVar1 = *pVVar1 + 8;
  return;
}

Assistant:

void addCompoundValue(uint8_t type) {
    reserve(9);
    // an Array or Object is started:
    _stack.push_back(CompoundInfo{_pos, _indexes.size()});
    appendByteUnchecked(type);
    std::memset(_start + _pos, 0, 8);
    advance(8);  // Will be filled later with bytelength and nr subs
  }